

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::ensure_correct_builtin_type
          (CompilerMSL *this,uint32_t type_id,BuiltIn builtin)

{
  bool bVar1;
  uint32_t uVar2;
  TypedID<(spirv_cross::Types)1> local_4c;
  SPIRType *local_48;
  SPIRType *ptr_type;
  SPIRType *pSStack_38;
  uint32_t ptr_type_id;
  SPIRType *base_type;
  uint32_t base_type_id;
  uint32_t next_id;
  SPIRType *type;
  BuiltIn builtin_local;
  uint32_t type_id_local;
  CompilerMSL *this_local;
  
  type._0_4_ = builtin;
  type._4_4_ = type_id;
  _builtin_local = this;
  _base_type_id = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
  if ((((BuiltIn)type != BuiltInSampleMask) ||
      (bVar1 = Compiler::is_array((Compiler *)this,_base_type_id), !bVar1)) &&
     ((((BuiltIn)type != BuiltInLayer &&
       (((BuiltIn)type != BuiltInViewportIndex && ((BuiltIn)type != BuiltInFragStencilRefEXT)))) ||
      (*(int *)&(_base_type_id->super_IVariant).field_0xc == 8)))) {
    return type._4_4_;
  }
  uVar2 = 1;
  if ((_base_type_id->pointer & 1U) != 0) {
    uVar2 = 2;
  }
  base_type._0_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,uVar2)
  ;
  base_type._4_4_ = (uint32_t)base_type + 1;
  pSStack_38 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,(uint32_t)base_type);
  uVar2 = base_type._4_4_;
  *(undefined4 *)&(pSStack_38->super_IVariant).field_0xc = 8;
  pSStack_38->width = 0x20;
  if ((_base_type_id->pointer & 1U) == 0) {
    this_local._4_4_ = (uint32_t)base_type;
  }
  else {
    ptr_type._4_4_ = base_type._4_4_;
    base_type._4_4_ = base_type._4_4_ + 1;
    local_48 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,uVar2);
    SPIRType::operator=(local_48,pSStack_38);
    local_48->pointer = true;
    local_48->storage = _base_type_id->storage;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_4c,(uint32_t)base_type);
    (local_48->parent_type).id = local_4c.id;
    this_local._4_4_ = ptr_type._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::ensure_correct_builtin_type(uint32_t type_id, BuiltIn builtin)
{
	auto &type = get<SPIRType>(type_id);

	if ((builtin == BuiltInSampleMask && is_array(type)) ||
	    ((builtin == BuiltInLayer || builtin == BuiltInViewportIndex || builtin == BuiltInFragStencilRefEXT) &&
	     type.basetype != SPIRType::UInt))
	{
		uint32_t next_id = ir.increase_bound_by(type.pointer ? 2 : 1);
		uint32_t base_type_id = next_id++;
		auto &base_type = set<SPIRType>(base_type_id);
		base_type.basetype = SPIRType::UInt;
		base_type.width = 32;

		if (!type.pointer)
			return base_type_id;

		uint32_t ptr_type_id = next_id++;
		auto &ptr_type = set<SPIRType>(ptr_type_id);
		ptr_type = base_type;
		ptr_type.pointer = true;
		ptr_type.storage = type.storage;
		ptr_type.parent_type = base_type_id;
		return ptr_type_id;
	}

	return type_id;
}